

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int XmlUtf16Encode(int charNum,unsigned_short *buf)

{
  unsigned_short *buf_local;
  int charNum_local;
  
  if (charNum < 0) {
    buf_local._4_4_ = 0;
  }
  else if (charNum < 0x10000) {
    *buf = (unsigned_short)charNum;
    buf_local._4_4_ = 1;
  }
  else if (charNum < 0x110000) {
    *buf = (short)(charNum + -0x10000 >> 10) + 0xd800;
    buf[1] = ((ushort)(charNum + -0x10000) & 0x3ff) + 0xdc00;
    buf_local._4_4_ = 2;
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int FASTCALL
XmlUtf16Encode(int charNum, unsigned short *buf) {
  if (charNum < 0)
    return 0;
  if (charNum < 0x10000) {
    buf[0] = (unsigned short)charNum;
    return 1;
  }
  if (charNum < 0x110000) {
    charNum -= 0x10000;
    buf[0] = (unsigned short)((charNum >> 10) + 0xD800);
    buf[1] = (unsigned short)((charNum & 0x3FF) + 0xDC00);
    return 2;
  }
  return 0;
}